

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

int __thiscall qpdf::BaseHandle::copy(BaseHandle *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  _func_int **pp_Var2;
  tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_> tVar3;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var4;
  _Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_> _Var5;
  EVP_PKEY_CTX *pEVar6;
  int iVar7;
  pointer __p;
  shared_ptr<QPDFObject> *psVar8;
  variant_alternative_t<4UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar9;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *p_Var10;
  variant_alternative_t<3UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar11;
  variant_alternative_t<8UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *other;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  pointer __p_00;
  mapped_type *pmVar16;
  runtime_error *this_00;
  code *pcVar17;
  undefined *puVar18;
  _Base_ptr p_Var19;
  _Rb_tree_header *p_Var20;
  EVP_PKEY_CTX *dst_00;
  bool bVar21;
  QPDF_Array result;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  new_items;
  undefined1 local_a9;
  BaseHandle local_a8;
  undefined1 local_98 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> avStack_90 [2];
  undefined1 local_60 [8];
  _Rb_tree_node_base _Stack_58;
  size_t local_38;
  
  lVar1 = *(long *)dst;
  if (lVar1 == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = (int)*(char *)(lVar1 + 0x30);
    if (iVar7 == 0xd) {
      psVar8 = QPDF::resolve(*(QPDF **)(lVar1 + 0x48),*(QPDFObjGen *)(lVar1 + 0x50));
      iVar7 = (int)(char)*(__index_type *)
                          ((long)&(((psVar8->
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr)->value).
                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                  .
                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                  .
                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                  .
                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          + 0x30);
    }
  }
  switch(iVar7) {
  case 0:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              ((logic_error *)this_00,"QPDFObjectHandle: attempting to copy an uninitialized object"
              );
    goto LAB_001c46b1;
  case 1:
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
    p_Var12->_M_use_count = 1;
    p_Var12->_M_weak_count = 1;
    p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f3ae8;
    *(undefined1 *)&p_Var12[4]._vptr__Sp_counted_base = 1;
    goto LAB_001c4203;
  case 2:
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
    p_Var12->_M_use_count = 1;
    p_Var12->_M_weak_count = 1;
    p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f3ae8;
    *(undefined1 *)&p_Var12[4]._vptr__Sp_counted_base = 2;
LAB_001c4203:
    p_Var12[4]._M_use_count = 0;
    p_Var12[4]._M_weak_count = 0;
    p_Var12[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[5]._M_use_count = 0;
    p_Var12[5]._M_weak_count = 0;
    p_Var12[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[6]._M_use_count = -1;
    p_Var12[6]._M_weak_count = -1;
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var12;
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var12 + 1);
    break;
  case 3:
    pvVar11 = std::
              get<3ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           **)dst);
    bVar21 = pvVar11->val;
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
    p_Var12->_M_use_count = 1;
    p_Var12->_M_weak_count = 1;
    p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f3ae8;
    *(bool *)&p_Var12[1]._vptr__Sp_counted_base = bVar21;
    *(undefined1 *)&p_Var12[4]._vptr__Sp_counted_base = 3;
    goto LAB_001c4112;
  case 4:
    pvVar9 = std::
             get<4ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          **)dst);
    pp_Var2 = (_func_int **)pvVar9->val;
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
    p_Var12->_M_use_count = 1;
    p_Var12->_M_weak_count = 1;
    p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f3ae8;
    p_Var12[1]._vptr__Sp_counted_base = pp_Var2;
    *(undefined1 *)&p_Var12[4]._vptr__Sp_counted_base = 4;
LAB_001c4112:
    p_Var12[4]._M_use_count = 0;
    p_Var12[4]._M_weak_count = 0;
    p_Var12[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[5]._M_use_count = 0;
    p_Var12[5]._M_weak_count = 0;
    p_Var12[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var12[6]._M_use_count = -1;
    p_Var12[6]._M_weak_count = -1;
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var12;
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var12 + 1);
    break;
  case 5:
    pbVar13 = &std::
               get<5ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                            **)dst)->val;
    QPDFObject::create<QPDF_Real,std::__cxx11::string&>((QPDFObject *)this,pbVar13);
    break;
  case 6:
    pbVar13 = &std::
               get<6ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                            **)dst)->val;
    QPDFObject::create<QPDF_String,std::__cxx11::string&>((QPDFObject *)this,pbVar13);
    break;
  case 7:
    pbVar13 = &std::
               get<7ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                            **)dst)->name;
    QPDFObject::create<QPDF_Name,std::__cxx11::string&>((QPDFObject *)this,pbVar13);
    break;
  case 8:
    other = std::
            get<8ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                      (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         **)dst);
    if ((char)src == '\0') {
      if ((other->sp)._M_t.
          super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
          super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
          super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl == (Sparse *)0x0) {
        local_98 = (undefined1  [8])0x0;
        avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::reserve
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_98,
                   (long)(other->elements).
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(other->elements).
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4);
        dst_00 = (EVP_PKEY_CTX *)
                 (other->elements).
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar6 = (EVP_PKEY_CTX *)
                 (other->elements).
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (dst_00 != pEVar6) {
          do {
            _Var5.super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl =
                 *(_Head_base<0UL,_QPDF_Array::Sparse_*,_false> *)dst_00;
            if ((_Var5.super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl ==
                 (Sparse *)0x0) ||
               (((QPDFObjGen *)
                ((long)_Var5.super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl + 0x50)
                )->obj != 0)) {
              _Stack_58._0_8_ = *(undefined8 *)(dst_00 + 8);
              if ((_Base_ptr)_Stack_58._0_8_ != (_Base_ptr)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&((_Base_ptr)_Stack_58._0_8_)->_M_parent =
                       *(int *)&((_Base_ptr)_Stack_58._0_8_)->_M_parent + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&((_Base_ptr)_Stack_58._0_8_)->_M_parent =
                       *(int *)&((_Base_ptr)_Stack_58._0_8_)->_M_parent + 1;
                }
              }
              bVar21 = false;
              local_60 = (undefined1  [8])
                         _Var5.super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
            }
            else {
              copy(&local_a8,dst_00,(EVP_PKEY_CTX *)0x0);
              local_60 = (undefined1  [8])
                         local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
              _Stack_58._0_8_ =
                   local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              bVar21 = true;
            }
            std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
            emplace_back<QPDFObjectHandle_const>
                      ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)local_98,
                       (QPDFObjectHandle *)local_60);
            if ((_Base_ptr)_Stack_58._0_8_ != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_58._0_8_);
            }
            if ((bVar21) &&
               ((_Base_ptr)
                local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Base_ptr)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            dst_00 = dst_00 + 0x10;
          } while (dst_00 != pEVar6);
        }
        local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffffffffff00);
        QPDFObject::
        create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,bool>
                  ((QPDFObject *)this,
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_98,
                   (bool *)local_60);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_98);
        break;
      }
      avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98 = (undefined1  [8])0x0;
      avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      __p_00 = (pointer)operator_new(0x38);
      p_Var20 = &(__p_00->elements)._M_t._M_impl.super__Rb_tree_header;
      (__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      (__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      *(undefined8 *)&(__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
      (__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      *(undefined8 *)__p_00 = 0;
      *(undefined8 *)&(__p_00->elements)._M_t._M_impl = 0;
      (__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var20->_M_header;
      (__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var20->_M_header
      ;
      local_60 = (undefined1  [8])0x0;
      std::__uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::reset
                ((__uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)
                 local_98,__p_00);
      std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
                ((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)
                 local_60);
      _Var4._M_head_impl =
           (other->sp)._M_t.
           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
           super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
      *(int *)&(((shared_ptr<QPDFLogger> *)local_98)->
               super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (_Var4._M_head_impl)->size;
      p_Var15 = *(_Base_ptr *)((long)&(_Var4._M_head_impl)->elements + 0x18);
      p_Var19 = (_Base_ptr)((long)&(_Var4._M_head_impl)->elements + 8);
      if (p_Var15 != p_Var19) {
        do {
          _Var5.super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl =
               (_Head_base<0UL,_QPDF_Array::Sparse_*,_false>)p_Var15[1]._M_parent;
          if (_Var5.super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl == (Sparse *)0x0
             ) {
            bVar21 = false;
          }
          else {
            bVar21 = ((QPDFObjGen *)
                     ((long)_Var5.super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl +
                     0x50))->obj != 0;
          }
          if (bVar21) {
            _Stack_58._0_8_ = p_Var15[1]._M_left;
            local_60 = (undefined1  [8])
                       _Var5.super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
            if ((_Base_ptr)_Stack_58._0_8_ != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((_Base_ptr)_Stack_58._0_8_)->_M_parent =
                     *(int *)&((_Base_ptr)_Stack_58._0_8_)->_M_parent + 1;
                UNLOCK();
              }
              else {
                *(int *)&((_Base_ptr)_Stack_58._0_8_)->_M_parent =
                     *(int *)&((_Base_ptr)_Stack_58._0_8_)->_M_parent + 1;
              }
            }
          }
          else {
            copy(&local_a8,(EVP_PKEY_CTX *)&p_Var15[1]._M_parent,(EVP_PKEY_CTX *)0x0);
            local_60 = (undefined1  [8])
                       local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
            _Stack_58._0_8_ =
                 local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
            local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          pmVar16 = std::
                    map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                    ::operator[]((map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                                  *)&(((shared_ptr<QPDFLogger> *)local_98)->
                                     super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_refcount,(key_type *)(p_Var15 + 1));
          (pmVar16->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_60;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pmVar16->super_BaseHandle).obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_58);
          if ((_Base_ptr)_Stack_58._0_8_ != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_58._0_8_);
          }
          if ((!bVar21) &&
             ((_Base_ptr)
              local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Base_ptr)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while (p_Var15 != p_Var19);
      }
      QPDFObject::create<QPDF_Array,QPDF_Array>((QPDFObject *)this,(QPDF_Array *)local_98);
    }
    else {
      QPDF_Array::QPDF_Array((QPDF_Array *)local_98,other);
      (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      p_Var12->_M_use_count = 1;
      p_Var12->_M_weak_count = 1;
      p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f3ae8;
      p_Var12[1]._vptr__Sp_counted_base = (_func_int **)local_98;
      local_98 = (undefined1  [8])0x0;
      *(pointer *)&p_Var12[1]._M_use_count =
           avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
      p_Var12[2]._vptr__Sp_counted_base =
           (_func_int **)
           avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)&p_Var12[2]._M_use_count =
           avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 *)&p_Var12[4]._vptr__Sp_counted_base = 8;
      p_Var12[4]._M_use_count = 0;
      p_Var12[4]._M_weak_count = 0;
      p_Var12[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var12[5]._M_use_count = 0;
      p_Var12[5]._M_weak_count = 0;
      p_Var12[6]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var12[6]._M_use_count = -1;
      p_Var12[6]._M_weak_count = -1;
      (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var12;
      (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var12 + 1);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(avStack_90);
    std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
              ((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)local_98)
    ;
    break;
  case 9:
    p_Var10 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               *)std::
                 get<9ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                           (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                              **)dst);
    if ((char)src == '\0') {
      _Stack_58._M_left = &_Stack_58;
      _Stack_58._0_8_ = _Stack_58._0_8_ & 0xffffffff00000000;
      _Stack_58._M_parent = (_Base_ptr)0x0;
      local_38 = 0;
      p_Var15 = (p_Var10->_M_impl).super__Rb_tree_header._M_header._M_left;
      p_Var20 = &(p_Var10->_M_impl).super__Rb_tree_header;
      _Stack_58._M_right = _Stack_58._M_left;
      if ((_Rb_tree_header *)p_Var15 != p_Var20) {
        do {
          tVar3.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
          super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_> *)
                (p_Var15 + 2);
          if (tVar3.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
              super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl ==
              (_Head_base<0UL,_QPDF::Members_*,_false>)0x0) {
            bVar21 = false;
          }
          else {
            bVar21 = ((QPDFObjGen *)
                     ((long)tVar3.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl + 0x50))->
                     obj != 0;
          }
          if (bVar21) {
            avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)p_Var15[2]._M_parent;
            local_98 = (undefined1  [8])
                       tVar3.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
            if ((_Base_ptr)
                avStack_90[0].
                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((_Base_ptr)
                         avStack_90[0].
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start)->_M_parent =
                     *(int *)&((_Base_ptr)
                              avStack_90[0].
                              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_parent + 1;
                UNLOCK();
              }
              else {
                *(int *)&((_Base_ptr)
                         avStack_90[0].
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start)->_M_parent =
                     *(int *)&((_Base_ptr)
                              avStack_90[0].
                              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_parent + 1;
              }
            }
          }
          else {
            copy(&local_a8,(EVP_PKEY_CTX *)(p_Var15 + 2),(EVP_PKEY_CTX *)0x0);
            local_98 = (undefined1  [8])
                       local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
            avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                                  *)local_60,(key_type *)(p_Var15 + 1));
          (pmVar14->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_98;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pmVar14->super_BaseHandle).obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)avStack_90);
          if ((_Base_ptr)
              avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       avStack_90[0].
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start);
          }
          if ((!bVar21) &&
             ((_Base_ptr)
              local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Base_ptr)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 != p_Var20);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  *)local_98,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  *)local_60);
      std::__shared_ptr<QPDFObject,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<QPDFObject>,QPDF_Dictionary>
                ((__shared_ptr<QPDFObject,(__gnu_cxx::_Lock_policy)2> *)this,
                 (allocator<QPDFObject> *)&local_a9,(QPDF_Dictionary *)local_98);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                   *)local_98);
      p_Var10 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                 *)local_60;
    }
    else {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  *)local_98,p_Var10);
      std::__shared_ptr<QPDFObject,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<QPDFObject>,QPDF_Dictionary>
                ((__shared_ptr<QPDFObject,(__gnu_cxx::_Lock_policy)2> *)this,
                 (allocator<QPDFObject> *)local_60,(QPDF_Dictionary *)local_98);
      p_Var10 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                 *)local_98;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree(p_Var10);
    break;
  case 10:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"stream objects cannot be cloned");
    puVar18 = &std::runtime_error::typeinfo;
    pcVar17 = std::runtime_error::~runtime_error;
    goto LAB_001c46eb;
  case 0xb:
    pbVar13 = &std::
               get<11ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                            **)dst)->val;
    QPDFObject::create<QPDF_Operator,std::__cxx11::string&>((QPDFObject *)this,pbVar13);
    break;
  case 0xc:
    pbVar13 = &std::
               get<12ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                            **)dst)->val;
    QPDFObject::create<QPDF_InlineImage,std::__cxx11::string&>((QPDFObject *)this,pbVar13);
    break;
  case 0xd:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              ((logic_error *)this_00,"QPDFObjectHandle: attempting to unparse a reserved object");
    goto LAB_001c46b1;
  case 0xe:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              ((logic_error *)this_00,
               "attempted to shallow copy QPDFObjectHandle from destroyed QPDF");
LAB_001c46b1:
    puVar18 = &std::logic_error::typeinfo;
    pcVar17 = std::logic_error::~logic_error;
LAB_001c46eb:
    __cxa_throw(this_00,puVar18,pcVar17);
  case 0xf:
    QPDF::getObject((QPDF *)local_98,*(QPDFObjGen *)(*(long *)dst + 0x48));
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98;
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
         _M_impl.super__Vector_impl_data._M_start;
    if ((_Base_ptr)
        avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
        _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((long)avStack_90[0].
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start + 8) =
             *(int *)((long)avStack_90[0].
                            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)((long)avStack_90[0].
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start + 8) =
             *(int *)((long)avStack_90[0].
                            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8) + 1;
      }
    }
    if ((_Base_ptr)
        avStack_90[0].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
        _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 avStack_90[0].
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    break;
  default:
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  return (int)this;
}

Assistant:

std::shared_ptr<QPDFObject>
BaseHandle::copy(bool shallow) const
{
    switch (resolved_type_code()) {
    case ::ot_uninitialized:
        throw std::logic_error("QPDFObjectHandle: attempting to copy an uninitialized object");
        return {}; // does not return
    case ::ot_reserved:
        return QPDFObject::create<QPDF_Reserved>();
    case ::ot_null:
        return QPDFObject::create<QPDF_Null>();
    case ::ot_boolean:
        return QPDFObject::create<QPDF_Bool>(std::get<QPDF_Bool>(obj->value).val);
    case ::ot_integer:
        return QPDFObject::create<QPDF_Integer>(std::get<QPDF_Integer>(obj->value).val);
    case ::ot_real:
        return QPDFObject::create<QPDF_Real>(std::get<QPDF_Real>(obj->value).val);
    case ::ot_string:
        return QPDFObject::create<QPDF_String>(std::get<QPDF_String>(obj->value).val);
    case ::ot_name:
        return QPDFObject::create<QPDF_Name>(std::get<QPDF_Name>(obj->value).name);
    case ::ot_array:
        {
            auto const& a = std::get<QPDF_Array>(obj->value);
            if (shallow) {
                return QPDFObject::create<QPDF_Array>(a);
            } else {
                QTC::TC("qpdf", "QPDF_Array copy", a.sp ? 0 : 1);
                if (a.sp) {
                    QPDF_Array result;
                    result.sp = std::make_unique<QPDF_Array::Sparse>();
                    result.sp->size = a.sp->size;
                    for (auto const& [idx, oh]: a.sp->elements) {
                        result.sp->elements[idx] = oh.indirect() ? oh : oh.copy();
                    }
                    return QPDFObject::create<QPDF_Array>(std::move(result));
                } else {
                    std::vector<QPDFObjectHandle> result;
                    result.reserve(a.elements.size());
                    for (auto const& element: a.elements) {
                        result.emplace_back(
                            element ? (element.indirect() ? element : element.copy()) : element);
                    }
                    return QPDFObject::create<QPDF_Array>(std::move(result), false);
                }
            }
        }
    case ::ot_dictionary:
        {
            auto const& d = std::get<QPDF_Dictionary>(obj->value);
            if (shallow) {
                return QPDFObject::create<QPDF_Dictionary>(d.items);
            } else {
                std::map<std::string, QPDFObjectHandle> new_items;
                for (auto const& [key, val]: d.items) {
                    new_items[key] = val.indirect() ? val : val.copy();
                }
                return QPDFObject::create<QPDF_Dictionary>(new_items);
            }
        }
    case ::ot_stream:
        QTC::TC("qpdf", "QPDF_Stream ERR shallow copy stream");
        throw std::runtime_error("stream objects cannot be cloned");
        return {}; // does not return
    case ::ot_operator:
        return QPDFObject::create<QPDF_Operator>(std::get<QPDF_Operator>(obj->value).val);
    case ::ot_inlineimage:
        return QPDFObject::create<QPDF_InlineImage>(std::get<QPDF_InlineImage>(obj->value).val);
    case ::ot_unresolved:
        throw std::logic_error("QPDFObjectHandle: attempting to unparse a reserved object");
        return {}; // does not return
    case ::ot_destroyed:
        throw std::logic_error("attempted to shallow copy QPDFObjectHandle from destroyed QPDF");
        return {}; // does not return
    case ::ot_reference:
        return obj->qpdf->getObject(obj->og).getObj();
    }
    return {}; // unreachable
}